

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O0

Addr * hwnet::Addr::MakeIP4Addr(Addr *__return_storage_ptr__,char *ip,int port)

{
  uint16_t uVar1;
  int iVar2;
  Addr *addr;
  int port_local;
  char *ip_local;
  
  Addr(__return_storage_ptr__);
  memset(__return_storage_ptr__,0,0x70);
  (__return_storage_ptr__->sockaddr).in.sin_family = 2;
  uVar1 = htons((uint16_t)port);
  (__return_storage_ptr__->sockaddr).in.sin_port = uVar1;
  iVar2 = inet_pton(2,ip,(void *)((long)&__return_storage_ptr__->sockaddr + 4));
  if (iVar2 < 0) {
    __return_storage_ptr__->addrType = 0;
  }
  else {
    __return_storage_ptr__->addrType = 1;
    __return_storage_ptr__->family = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

static Addr MakeIP4Addr(const char *ip,int port) {
    	Addr addr;
    	memset(&addr.sockaddr,0,sizeof(addr.sockaddr));
    	addr.sockaddr.in.sin_family = AF_INET;
    	addr.sockaddr.in.sin_port = htons(port);
    	if(inet_pton(AF_INET,ip,&addr.sockaddr.in.sin_addr) < 0) {
    		addr.addrType = SOCK_ADDR_EMPTY;
    	} else {
    		addr.addrType = SOCK_ADDR_IPV4;
    	    addr.family = AF_INET;
        }
    	return addr;
    }